

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseData<QVariant>::resolve<QVariant>
          (PromiseData<QVariant> *this,QVariant *value)

{
  PromiseValue<QVariant> local_28;
  QVariant *local_18;
  QVariant *value_local;
  PromiseData<QVariant> *this_local;
  
  local_18 = value;
  value_local = (QVariant *)this;
  PromiseValue<QVariant>::PromiseValue(&local_28,value);
  PromiseValue<QVariant>::operator=(&this->m_value,&local_28);
  PromiseValue<QVariant>::~PromiseValue(&local_28);
  PromiseDataBase<QVariant,_void_(const_QVariant_&)>::setSettled
            (&this->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }